

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  Db *pDVar1;
  uint uVar2;
  int nKey;
  int iVar3;
  Table *pTVar4;
  uint uVar5;
  uint uVar6;
  
  nKey = sqlite3Strlen30(zName);
  uVar2 = db->nDb;
  if (db->nDb < 1) {
    uVar2 = 0;
  }
  uVar6 = 0;
  while( true ) {
    if (uVar2 == uVar6) {
      return (Table *)0x0;
    }
    uVar5 = uVar6 < 2 ^ uVar6;
    pDVar1 = db->aDb;
    if (((zDatabase == (char *)0x0) ||
        (iVar3 = sqlite3_stricmp(zDatabase,pDVar1[uVar5].zName), iVar3 == 0)) &&
       (pTVar4 = (Table *)sqlite3HashFind(&(pDVar1[uVar5].pSchema)->tblHash,zName,nKey),
       pTVar4 != (Table *)0x0)) break;
    uVar6 = uVar6 + 1;
  }
  return pTVar4;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;
  int nName;
  assert( zName!=0 );
  nName = sqlite3Strlen30(zName);
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
    if( zDatabase!=0 && sqlite3StrICmp(zDatabase, db->aDb[j].zName) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName, nName);
    if( p ) break;
  }
  return p;
}